

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

bool QFileSystemEngine::renameFile
               (QFileSystemEntry *source,QFileSystemEntry *target,QSystemError *error)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint *puVar4;
  ulong uVar5;
  int *piVar6;
  char *pcVar7;
  char *pcVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_68;
  QArrayDataPointer<char> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::nativeFilePath((NativePath *)&local_48,source);
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::nativeFilePath((NativePath *)&local_68,target);
  if (((((undefined1 *)local_48.size == (undefined1 *)0x0) ||
       (bVar2 = qIsFilenameBroken((QByteArray *)&local_48), bVar2)) ||
      ((undefined1 *)local_68.size == (undefined1 *)0x0)) ||
     (bVar2 = qIsFilenameBroken((QByteArray *)&local_68), bVar2)) {
    piVar6 = __errno_location();
    *piVar6 = 0x16;
  }
  else {
    pcVar8 = local_48.ptr;
    if (local_48.ptr == (char *)0x0) {
      pcVar8 = "";
    }
    pcVar7 = local_68.ptr;
    if (local_68.ptr == (char *)0x0) {
      pcVar7 = "";
    }
    iVar3 = renameat2(0xffffffffffffff9c,pcVar8,0xffffff9c,pcVar7,1);
    bVar2 = true;
    if (iVar3 == 0) goto LAB_0012af8b;
    puVar4 = (uint *)__errno_location();
    uVar5 = (ulong)*puVar4;
    if (uVar5 == 0x16) {
      pcVar8 = local_48.ptr;
      if (local_48.ptr == (char *)0x0) {
        pcVar8 = "";
      }
      pcVar7 = local_68.ptr;
      if (local_68.ptr == (char *)0x0) {
        pcVar7 = "";
      }
      iVar3 = link(pcVar8,pcVar7);
      if (iVar3 == 0) {
        pcVar8 = local_48.ptr;
        if (local_48.ptr == (char *)0x0) {
          pcVar8 = "";
        }
        iVar3 = unlink(pcVar8);
        if (iVar3 == 0) goto LAB_0012af8b;
        uVar1 = *puVar4;
        pcVar8 = local_68.ptr;
        if (local_68.ptr == (char *)0x0) {
          pcVar8 = "";
        }
        unlink(pcVar8);
        *error = (QSystemError)((ulong)uVar1 | 0x100000000);
        goto LAB_0012af89;
      }
      uVar5 = (ulong)*puVar4;
      if ((0x24 < uVar5) || ((0x1040162004U >> (uVar5 & 0x3f) & 1) == 0)) {
        pcVar8 = local_48.ptr;
        if (local_48.ptr == (char *)0x0) {
          pcVar8 = "";
        }
        pcVar7 = local_68.ptr;
        if (local_68.ptr == (char *)0x0) {
          pcVar7 = "";
        }
        iVar3 = rename(pcVar8,pcVar7);
        if (iVar3 == 0) goto LAB_0012af8b;
        uVar5 = (ulong)*puVar4;
      }
    }
    *error = (QSystemError)(uVar5 | 0x100000000);
  }
LAB_0012af89:
  bVar2 = false;
LAB_0012af8b:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QFileSystemEngine::renameFile(const QFileSystemEntry &source, const QFileSystemEntry &target, QSystemError &error)
{
    QFileSystemEntry::NativePath srcPath = source.nativeFilePath();
    QFileSystemEntry::NativePath tgtPath = target.nativeFilePath();

    Q_CHECK_FILE_NAME(srcPath, false);
    Q_CHECK_FILE_NAME(tgtPath, false);

#if defined(RENAME_NOREPLACE) && QT_CONFIG(renameat2)
    if (renameat2(AT_FDCWD, srcPath, AT_FDCWD, tgtPath, RENAME_NOREPLACE) == 0)
        return true;

    // We can also get EINVAL for some non-local filesystems.
    if (errno != EINVAL) {
        error = QSystemError(errno, QSystemError::StandardLibraryError);
        return false;
    }
#endif
#if defined(Q_OS_DARWIN) && defined(RENAME_EXCL)
    if (renameatx_np(AT_FDCWD, srcPath, AT_FDCWD, tgtPath, RENAME_EXCL) == 0)
        return true;
    if (errno != ENOTSUP) {
        error = QSystemError(errno, QSystemError::StandardLibraryError);
        return false;
    }
#endif

    if (SupportsHardlinking && ::link(srcPath, tgtPath) == 0) {
        if (::unlink(srcPath) == 0)
            return true;

        // if we managed to link but can't unlink the source, it's likely
        // it's in a directory we don't have write access to; fail the
        // renaming instead
        int savedErrno = errno;

        // this could fail too, but there's nothing we can do about it now
        ::unlink(tgtPath);

        error = QSystemError(savedErrno, QSystemError::StandardLibraryError);
        return false;
    } else if (!SupportsHardlinking) {
        // man 2 link on Linux has:
        // EPERM  The filesystem containing oldpath and newpath does not
        //        support the creation of hard links.
        errno = EPERM;
    }

    switch (errno) {
    case EACCES:
    case EEXIST:
    case ENAMETOOLONG:
    case ENOENT:
    case ENOTDIR:
    case EROFS:
    case EXDEV:
        // accept the error from link(2) (especially EEXIST) and don't retry
        break;

    default:
        // fall back to rename()
        // ### Race condition. If a file is moved in after this, it /will/ be
        // overwritten.
        if (::rename(srcPath, tgtPath) == 0)
            return true;
    }

    error = QSystemError(errno, QSystemError::StandardLibraryError);
    return false;
}